

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O1

void __thiscall
Assimp::AssbinExport::WriteBinaryDump
          (AssbinExport *this,char *pFile,IOSystem *pIOSystem,aiScene *pScene)

{
  int iVar1;
  undefined4 extraout_var;
  tm *__tp;
  char *pcVar2;
  undefined4 extraout_var_00;
  void *pvVar3;
  runtime_error *this_00;
  char cmd [2];
  uLongf compressedSize;
  uLongf uncompressedSize;
  time_t tt;
  char buff [256];
  tm now;
  char s [64];
  char local_22a [2];
  ulong local_228;
  size_t local_220;
  undefined1 *local_218 [2];
  undefined1 local_208 [16];
  time_t local_1f8;
  AssbinChunkWriter local_1f0;
  uint local_1b8 [66];
  tm local_b0;
  char local_78 [72];
  IOStream *container;
  
  iVar1 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFile,"wb");
  container = (IOStream *)CONCAT44(extraout_var,iVar1);
  if (container != (IOStream *)0x0) {
    local_1f8 = time((time_t *)0x0);
    __tp = gmtime_r(&local_1f8,&local_b0);
    local_78[0x30] = '\0';
    local_78[0x31] = '\0';
    local_78[0x32] = '\0';
    local_78[0x33] = '\0';
    local_78[0x34] = '\0';
    local_78[0x35] = '\0';
    local_78[0x36] = '\0';
    local_78[0x37] = '\0';
    local_78[0x38] = '\0';
    local_78[0x39] = '\0';
    local_78[0x3a] = '\0';
    local_78[0x3b] = '\0';
    local_78[0x3c] = '\0';
    local_78[0x3d] = '\0';
    local_78[0x3e] = '\0';
    local_78[0x3f] = '\0';
    local_78[0x20] = '\0';
    local_78[0x21] = '\0';
    local_78[0x22] = '\0';
    local_78[0x23] = '\0';
    local_78[0x24] = '\0';
    local_78[0x25] = '\0';
    local_78[0x26] = '\0';
    local_78[0x27] = '\0';
    local_78[0x28] = '\0';
    local_78[0x29] = '\0';
    local_78[0x2a] = '\0';
    local_78[0x2b] = '\0';
    local_78[0x2c] = '\0';
    local_78[0x2d] = '\0';
    local_78[0x2e] = '\0';
    local_78[0x2f] = '\0';
    local_78[0x10] = '\0';
    local_78[0x11] = '\0';
    local_78[0x12] = '\0';
    local_78[0x13] = '\0';
    local_78[0x14] = '\0';
    local_78[0x15] = '\0';
    local_78[0x16] = '\0';
    local_78[0x17] = '\0';
    local_78[0x18] = '\0';
    local_78[0x19] = '\0';
    local_78[0x1a] = '\0';
    local_78[0x1b] = '\0';
    local_78[0x1c] = '\0';
    local_78[0x1d] = '\0';
    local_78[0x1e] = '\0';
    local_78[0x1f] = '\0';
    local_78[0] = '\0';
    local_78[1] = '\0';
    local_78[2] = '\0';
    local_78[3] = '\0';
    local_78[4] = '\0';
    local_78[5] = '\0';
    local_78[6] = '\0';
    local_78[7] = '\0';
    local_78[8] = '\0';
    local_78[9] = '\0';
    local_78[10] = '\0';
    local_78[0xb] = '\0';
    local_78[0xc] = '\0';
    local_78[0xd] = '\0';
    local_78[0xe] = '\0';
    local_78[0xf] = '\0';
    pcVar2 = asctime(__tp);
    snprintf(local_78,0x40,"ASSIMP.binary-dump.%s",pcVar2);
    (*container->_vptr_IOStream[3])(container,local_78,0x2c,1);
    local_1b8[0] = 1;
    (*container->_vptr_IOStream[3])(container,local_1b8,4,1);
    local_1b8[0] = 0;
    (*container->_vptr_IOStream[3])(container,local_1b8,4,1);
    local_1b8[0] = aiGetVersionRevision();
    (*container->_vptr_IOStream[3])(container,local_1b8,4,1);
    local_1b8[0] = aiGetCompileFlags();
    (*container->_vptr_IOStream[3])(container,local_1b8,4,1);
    local_1b8[0]._0_2_ = (ushort)this->shortened;
    (*container->_vptr_IOStream[3])(container,local_1b8,2,1);
    local_1b8[0] = CONCAT22(local_1b8[0]._2_2_,(ushort)this->compressed);
    (*container->_vptr_IOStream[3])(container,local_1b8,2,1);
    strncpy((char *)local_1b8,pFile,0x100);
    (*container->_vptr_IOStream[3])(container,local_1b8,1,0x100);
    local_22a[0] = '\0';
    local_22a[1] = '\0';
    strncpy((char *)local_1b8,local_22a,0x80);
    (*container->_vptr_IOStream[3])(container,local_1b8,1,0x80);
    local_1b8[0] = 0xcdcdcdcd;
    local_1b8[1] = 0xcdcdcdcd;
    local_1b8[2] = 0xcdcdcdcd;
    local_1b8[3] = 0xcdcdcdcd;
    local_1b8[4] = 0xcdcdcdcd;
    local_1b8[5] = 0xcdcdcdcd;
    local_1b8[6] = 0xcdcdcdcd;
    local_1b8[7] = 0xcdcdcdcd;
    local_1b8[8] = 0xcdcdcdcd;
    local_1b8[9] = 0xcdcdcdcd;
    local_1b8[10] = 0xcdcdcdcd;
    local_1b8[0xb] = 0xcdcdcdcd;
    local_1b8[0xc] = 0xcdcdcdcd;
    local_1b8[0xd] = 0xcdcdcdcd;
    local_1b8[0xe] = 0xcdcdcdcd;
    local_1b8[0xf] = 0xcdcdcdcd;
    (*container->_vptr_IOStream[3])(container,local_1b8,1,0x40);
    iVar1 = (*container->_vptr_IOStream[5])(container);
    if (CONCAT44(extraout_var_00,iVar1) != 0x200) {
      __assert_fail("out->Tell() == 512",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Assbin/AssbinExporter.cpp"
                    ,0x324,
                    "void Assimp::AssbinExport::WriteBinaryDump(const char *, IOSystem *, const aiScene *)"
                   );
    }
    if (this->compressed == true) {
      local_1f0.super_IOStream._vptr_IOStream = (_func_int **)&PTR__AssbinChunkWriter_0081d3e0;
      local_1f0.buffer = (uint8_t *)0x0;
      local_1f0.magic = 0;
      local_1f0.container = (IOStream *)0x0;
      local_1f0.cur_size = 0;
      local_1f0.cursor = 0;
      local_1f0.initial = 0x1000;
      WriteBinaryScene(this,&local_1f0.super_IOStream,pScene);
      local_220 = local_1f0.cursor;
      local_228 = compressBound();
      pvVar3 = operator_new__(local_228);
      iVar1 = compress2(pvVar3,&local_228,local_1f0.buffer,local_220,9);
      if (iVar1 != 0) {
        operator_delete__(pvVar3);
        (*pIOSystem->_vptr_IOSystem[5])(pIOSystem,container);
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_218[0] = local_208;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_218,"Compression failed.","");
        std::runtime_error::runtime_error(this_00,(string *)local_218);
        *(undefined ***)this_00 = &PTR__runtime_error_0081d260;
        __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      (*container->_vptr_IOStream[3])(container,&local_220,4,1);
      (*container->_vptr_IOStream[3])(container,pvVar3,1,local_228);
      operator_delete__(pvVar3);
      AssbinChunkWriter::~AssbinChunkWriter(&local_1f0);
    }
    else {
      WriteBinaryScene(this,container,pScene);
    }
    (*pIOSystem->_vptr_IOSystem[5])(pIOSystem,container);
  }
  return;
}

Assistant:

void WriteBinaryDump(const char* pFile, IOSystem* pIOSystem, const aiScene* pScene)
    {
        IOStream * out = pIOSystem->Open( pFile, "wb" );
        if (!out) return;

        time_t tt = time(NULL);
#if _WIN32
        tm* p     = gmtime(&tt);
#else
        struct tm now;
        tm* p = gmtime_r(&tt, &now);
#endif

        // header
        char s[64];
        memset( s, 0, 64 );
#if _MSC_VER >= 1400
        sprintf_s(s,"ASSIMP.binary-dump.%s",asctime(p));
#else
        ai_snprintf(s,64,"ASSIMP.binary-dump.%s",asctime(p));
#endif
        out->Write( s, 44, 1 );
        // == 44 bytes

        Write<unsigned int>( out, ASSBIN_VERSION_MAJOR );
        Write<unsigned int>( out, ASSBIN_VERSION_MINOR );
        Write<unsigned int>( out, aiGetVersionRevision() );
        Write<unsigned int>( out, aiGetCompileFlags() );
        Write<uint16_t>( out, shortened );
        Write<uint16_t>( out, compressed );
        // ==  20 bytes

        char buff[256];
        strncpy(buff,pFile,256);
        out->Write(buff,sizeof(char),256);

        char cmd[] = "\0";
        strncpy(buff,cmd,128);
        out->Write(buff,sizeof(char),128);

        // leave 64 bytes free for future extensions
        memset(buff,0xcd,64);
        out->Write(buff,sizeof(char),64);
        // == 435 bytes

        // ==== total header size: 512 bytes
        ai_assert( out->Tell() == ASSBIN_HEADER_LENGTH );

        // Up to here the data is uncompressed. For compressed files, the rest
        // is compressed using standard DEFLATE from zlib.
        if (compressed)
        {
            AssbinChunkWriter uncompressedStream( NULL, 0 );
            WriteBinaryScene( &uncompressedStream, pScene );

            uLongf uncompressedSize = static_cast<uLongf>(uncompressedStream.Tell());
            uLongf compressedSize = (uLongf)compressBound(uncompressedSize);
            uint8_t* compressedBuffer = new uint8_t[ compressedSize ];

            int res = compress2( compressedBuffer, &compressedSize, (const Bytef*)uncompressedStream.GetBufferPointer(), uncompressedSize, 9 );
            if(res != Z_OK)
            {
                delete [] compressedBuffer;
                pIOSystem->Close(out);
                throw DeadlyExportError("Compression failed.");
            }

            out->Write( &uncompressedSize, sizeof(uint32_t), 1 );
            out->Write( compressedBuffer, sizeof(char), compressedSize );

            delete[] compressedBuffer;
        }
        else
        {
            WriteBinaryScene( out, pScene );
        }

        pIOSystem->Close( out );
    }